

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

string * spvDecodeLiteralStringOperand_abi_cxx11_
                   (string *__return_storage_ptr__,spv_parsed_instruction_t *inst,
                   uint16_t operand_index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  ushort uVar3;
  uint uVar4;
  pointer pcVar5;
  bool bVar6;
  uint *puVar7;
  byte bVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  if (inst->num_operands <= operand_index) {
    __assert_fail("operand_index < inst.num_operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                  ,0x44,
                  "std::string spvDecodeLiteralStringOperand(const spv_parsed_instruction_t &, const uint16_t)"
                 );
  }
  puVar7 = inst->words + inst->operands[operand_index].offset;
  uVar3 = inst->operands[operand_index].num_words;
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar11 = uVar3 == 0;
  if (bVar11) {
    bVar6 = false;
  }
  else {
    puVar2 = puVar7 + uVar3;
    bVar6 = false;
    do {
      uVar4 = *puVar7;
      bVar8 = 0;
      bVar10 = false;
      uVar9 = 0;
      do {
        if ((char)(uVar4 >> (bVar8 & 0x1f)) == '\0') {
          bVar6 = true;
          break;
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        bVar10 = 2 < uVar9;
        uVar9 = uVar9 + 1;
        bVar8 = bVar8 + 8;
      } while (uVar9 != 4);
      if (!bVar10) break;
      puVar7 = puVar7 + 1;
      bVar11 = puVar7 == puVar2;
    } while (!bVar11);
  }
  if (!bVar11) {
    if ((!bVar6) &&
       (pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar5 != paVar1)) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/string_utils.h"
                ,0x65,
                "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = const unsigned int *]"
               );
}

Assistant:

std::string spvDecodeLiteralStringOperand(const spv_parsed_instruction_t& inst,
                                          const uint16_t operand_index) {
  assert(operand_index < inst.num_operands);
  const spv_parsed_operand_t& operand = inst.operands[operand_index];

  return spvtools::utils::MakeString(inst.words + operand.offset,
                                     operand.num_words);
}